

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O2

void __thiscall CTcLibParser::scan_resource(CTcLibParser *this,char *val)

{
  char full_name [4096];
  char rel_path [4096];
  char acStack_2028 [4096];
  char local_1028 [4104];
  
  os_cvt_url_dir(local_1028,0x1000,val);
  os_build_full_path(acStack_2028,0x1000,this->lib_path_,local_1028);
  (*this->_vptr_CTcLibParser[0xf])(this,val,acStack_2028);
  return;
}

Assistant:

void CTcLibParser::scan_resource(const char *val)
{
    char rel_path[OSFNMAX];
    char full_name[OSFNMAX];

    /* convert the value from a URL-style path to a local path */
    os_cvt_url_dir(rel_path, sizeof(rel_path), val);

    /* build the full name */
    os_build_full_path(full_name, sizeof(full_name), lib_path_, rel_path);

    /* call the full resource filename scanner */
    scan_full_resource(val, full_name);
}